

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMetadata.cpp
# Opt level: O3

void __thiscall
utMetadata_get_set_string_Test_Test::TestBody(utMetadata_get_set_string_Test_Test *this)

{
  uint uVar1;
  uint *puVar2;
  aiMetadata *paVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  aiMetadata *paVar7;
  aiString *paVar8;
  aiMetadataEntry *paVar9;
  undefined4 *puVar10;
  ulong uVar11;
  char cVar12;
  byte bVar13;
  ulong uVar14;
  aiMetadata *paVar15;
  char *pcVar16;
  char *in_R9;
  undefined1 auVar17 [8];
  aiMetadata *__n;
  size_t __n_00;
  long lVar18;
  long lVar19;
  char *__end;
  size_t sVar20;
  AssertHelper AVar21;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  string key;
  aiString result;
  AssertHelper local_8b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  AssertHelper local_8a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_898;
  undefined1 local_890 [24];
  AssertHelper local_878;
  aiMetadata *local_870;
  undefined1 local_868 [16];
  aiMetadata *local_858;
  undefined1 local_850 [16];
  undefined1 local_840 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_838;
  undefined1 local_830 [1016];
  aiString local_438;
  
  paVar7 = (aiMetadata *)operator_new(0x18);
  paVar7->mNumProperties = 1;
  paVar8 = (aiString *)operator_new__(0x404);
  paVar8->length = 0;
  paVar8->data[0] = '\0';
  memset(paVar8->data + 1,0x1b,0x3ff);
  paVar7->mKeys = paVar8;
  paVar9 = (aiMetadataEntry *)operator_new__(0x10);
  *(undefined8 *)paVar9 = 0;
  paVar9->mData = (void *)0x0;
  paVar7->mValues = paVar9;
  (this->super_utMetadata).m_data = paVar7;
  local_868._8_8_ = local_850;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_868 + 8),"test","");
  paVar7 = (this->super_utMetadata).m_data;
  local_840 = (undefined1  [8])local_830;
  local_890._16_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"test","");
  auVar17 = local_840;
  sVar20 = 0x3ff;
  if (((ulong)local_838.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_838.ptr_ & 0xffffffff;
  }
  local_438.length = (uint)sVar20;
  memcpy(local_438.data,(void *)local_840,sVar20);
  paVar15 = local_858;
  local_438.data[sVar20] = '\0';
  if (paVar7->mNumProperties == 0) {
    cVar12 = '\0';
  }
  else if (local_858 == (aiMetadata *)0x0) {
    cVar12 = '\0';
  }
  else {
    if (local_858 < (aiMetadata *)&DAT_00000400) {
      paVar8 = paVar7->mKeys;
      paVar8->length = (ai_uint32)local_858;
      memcpy(paVar8->data,(void *)local_868._8_8_,(size_t)local_858);
      paVar8->data[(long)paVar15] = '\0';
    }
    paVar7->mValues->mType = AI_AISTRING;
    puVar10 = (undefined4 *)operator_new(0x404);
    __n_00 = 0x3ff;
    if ((uint)sVar20 < 0x3ff) {
      __n_00 = sVar20;
    }
    *puVar10 = (int)__n_00;
    memcpy(puVar10 + 1,local_438.data,__n_00);
    *(undefined1 *)((long)puVar10 + __n_00 + 4) = 0;
    paVar7->mValues->mData = puVar10;
    cVar12 = '\x01';
    auVar17 = local_840;
  }
  if (auVar17 != (undefined1  [8])local_830) {
    operator_delete((void *)auVar17);
  }
  local_840[0] = cVar12;
  local_838.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar12 == '\0') {
    testing::Message::Message((Message *)&local_8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_438,(internal *)local_840,(AssertionResult *)0x73b69d,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x99,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
    testing::internal::AssertHelper::operator=(&local_8b0,(Message *)&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    if ((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length) != local_438.data + 0xc) {
      operator_delete((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length));
    }
    if (((local_8a0.data_ != (AssertHelperData *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_8a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_8a0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_838,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar15 = *(aiMetadata **)(local_890._16_8_ + 0x10);
  local_840 = (undefined1  [8])local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"test","");
  auVar17 = local_840;
  __n = (aiMetadata *)0x3ff;
  if (((ulong)local_838.ptr_ & 0xfffffc00) == 0) {
    __n = (aiMetadata *)((ulong)local_838.ptr_ & 0xffffffff);
  }
  local_438.length = (uint)__n;
  memcpy(local_438.data,(void *)local_840,(size_t)__n);
  paVar3 = local_858;
  local_438.data[(long)__n] = '\0';
  cVar12 = '\x01';
  if ((10 < paVar15->mNumProperties) && (paVar7 = local_858, local_858 != (aiMetadata *)0x0)) {
    if (local_858 < (aiMetadata *)&DAT_00000400) {
      paVar8 = paVar15->mKeys;
      paVar8[10].length = (ai_uint32)local_858;
      memcpy(paVar8[10].data,(void *)local_868._8_8_,(size_t)local_858);
      *(char *)((long)&paVar3[0x1ac].mKeys + (long)paVar8->data) = '\0';
    }
    paVar15->mValues[10].mType = AI_AISTRING;
    puVar10 = (undefined4 *)operator_new(0x404);
    paVar7 = (aiMetadata *)0x3ff;
    if ((uint)__n < 0x3ff) {
      paVar7 = __n;
    }
    *puVar10 = (int)paVar7;
    memcpy(puVar10 + 1,local_438.data,(size_t)paVar7);
    *(char *)((long)(puVar10 + 1) + (long)paVar7) = '\0';
    paVar15->mValues[10].mData = puVar10;
    cVar12 = '\0';
    auVar17 = local_840;
  }
  if (auVar17 != (undefined1  [8])local_830) {
    operator_delete((void *)auVar17);
  }
  local_840[0] = cVar12;
  local_838.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar12 == '\0') {
    testing::Message::Message((Message *)&local_8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_438,(internal *)local_840,(AssertionResult *)0x73b69d,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x9c,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
    testing::internal::AssertHelper::operator=(&local_8b0,(Message *)&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    if ((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length) != local_438.data + 0xc) {
      operator_delete((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length));
    }
    if (((local_8a0.data_ != (AssertHelperData *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_8a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_8a0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_838,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = false;
  local_840 = (undefined1  [8])((ulong)local_840 & 0xffffff0000000000);
  memset(local_840 + 5,0x1b,0x3ff);
  paVar15 = *(aiMetadata **)(local_890._16_8_ + 0x10);
  sVar20 = 0x3ff;
  if (((ulong)local_858 & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_858 & 0xffffffff;
  }
  memcpy(local_438.data,(void *)local_868._8_8_,sVar20);
  local_438.data[sVar20] = '\0';
  uVar11 = (ulong)paVar15->mNumProperties;
  if (uVar11 != 0) {
    paVar7 = (aiMetadata *)paVar15->mKeys->data;
    bVar4 = true;
    uVar14 = 1;
    lVar18 = 0;
    local_870 = paVar15;
    local_868._0_8_ = sVar20;
    do {
      if ((*(int *)((long)&paVar7[-1].mValues + 4) == (int)sVar20) &&
         (iVar6 = bcmp(paVar7,local_438.data,sVar20), sVar20 = local_868._0_8_, iVar6 == 0)) {
        if (*(int *)((long)&local_870->mValues->mType + lVar18) == 5) {
          puVar2 = *(uint **)((long)&local_870->mValues->mData + lVar18);
          paVar7 = (aiMetadata *)0x1;
          if (puVar2 != (uint *)local_840) {
            uVar1 = *puVar2;
            local_840._0_4_ = uVar1;
            memcpy(local_840 + 4,puVar2 + 1,(ulong)uVar1);
            local_840[(ulong)uVar1 + 4] = 0;
          }
        }
        else {
          paVar7 = (aiMetadata *)0x0;
        }
        goto LAB_0033f1bc;
      }
      bVar4 = uVar14 < uVar11;
      lVar18 = lVar18 + 0x10;
      uVar14 = uVar14 + 1;
      paVar7 = (aiMetadata *)((long)&paVar7[0x2a].mValues + 4);
    } while (uVar11 << 4 != lVar18);
    bVar4 = false;
  }
LAB_0033f1bc:
  local_8a0.data_ = (AssertHelperData *)local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"test","");
  sVar20 = 0x3ff;
  if (((ulong)local_898.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_898.ptr_ & 0xffffffff;
  }
  local_438.length = (ai_uint32)sVar20;
  memcpy(local_438.data,local_8a0.data_,sVar20);
  local_438.data[sVar20] = '\0';
  testing::internal::CmpHelperEQ<aiString,aiString>
            ((internal *)&local_8b0,"aiString( std::string( \"test\" ) )","result",&local_438,
             (aiString *)local_840);
  if (local_8a0.data_ != (AssertHelperData *)local_890) {
    operator_delete(local_8a0.data_);
  }
  if (local_8b0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_438);
    if (local_8a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar16 = "";
    }
    else {
      pcVar16 = ((local_8a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa0,pcVar16);
    testing::internal::AssertHelper::operator=(&local_8a0,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    if (((CONCAT44(local_438.data._0_4_,local_438.length) != 0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((long *)CONCAT44(local_438.data._0_4_,local_438.length) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_438.data._0_4_,local_438.length) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar13 = bVar4 & (byte)paVar7;
  local_8a0.data_._0_1_ = bVar13;
  local_898.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar13 == 0) {
    testing::Message::Message((Message *)&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_438,(internal *)&local_8a0,(AssertionResult *)0x73b69d,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa1,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length) != local_438.data + 0xc) {
      operator_delete((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length));
    }
    if (((CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) != 0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_898,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar7 = *(aiMetadata **)(local_890._16_8_ + 0x10);
  local_8a0.data_ = (AssertHelperData *)local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"bla","");
  AVar21.data_ = local_8a0.data_;
  sVar20 = 0x3ff;
  if (((ulong)local_898.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_898.ptr_ & 0xffffffff;
  }
  memcpy(local_438.data,local_8a0.data_,sVar20);
  local_438.data[sVar20] = '\0';
  uVar11 = (ulong)paVar7->mNumProperties;
  if (uVar11 == 0) {
    bVar13 = 0;
  }
  else {
    local_890._16_8_ = AVar21.data_;
    lVar18 = uVar11 << 4;
    pcVar16 = paVar7->mKeys->data;
    uVar14 = 1;
    lVar19 = 0;
    paVar15 = (aiMetadata *)0x1;
    local_870 = paVar7;
    local_868._0_8_ = uVar11;
    do {
      bVar13 = (byte)paVar15;
      if ((((aiString *)(pcVar16 + -4))->length == (ai_uint32)sVar20) &&
         (iVar6 = bcmp(pcVar16,local_438.data,sVar20), uVar11 = local_868._0_8_, iVar6 == 0)) {
        AVar21.data_ = (AssertHelperData *)local_890._16_8_;
        if (*(int *)((long)&local_870->mValues->mType + lVar19) == 5) {
          puVar2 = *(uint **)((long)&local_870->mValues->mData + lVar19);
          paVar7 = (aiMetadata *)0x1;
          if (puVar2 != (uint *)local_840) {
            uVar1 = *puVar2;
            local_840._0_4_ = uVar1;
            memcpy(local_840 + 4,puVar2 + 1,(ulong)uVar1);
            local_840[(ulong)uVar1 + 4] = 0;
            AVar21.data_ = (AssertHelperData *)local_890._16_8_;
          }
        }
        else {
          paVar7 = (aiMetadata *)0x0;
        }
        goto LAB_0033f538;
      }
      paVar7 = (aiMetadata *)(ulong)(uVar14 < uVar11);
      lVar19 = lVar19 + 0x10;
      uVar14 = uVar14 + 1;
      pcVar16 = pcVar16 + 0x404;
      paVar15 = paVar7;
    } while (lVar18 != lVar19);
    bVar13 = 0;
    AVar21.data_ = (AssertHelperData *)local_890._16_8_;
  }
LAB_0033f538:
  bVar13 = bVar13 & (byte)paVar7;
  if (AVar21.data_ != (AssertHelperData *)local_890) {
    operator_delete(AVar21.data_);
  }
  local_8a0.data_ =
       (AssertHelperData *)(CONCAT71(local_8a0.data_._1_7_,~bVar13) & 0xffffffffffffff01);
  local_898.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar13 != 0) {
    testing::Message::Message((Message *)&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_438,(internal *)&local_8a0,(AssertionResult *)0x73b69d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa4,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length) != local_438.data + 0xc) {
      operator_delete((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length));
    }
    if (((CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) != 0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_8b0.data_._1_7_,local_8b0.data_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_898,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((undefined1 *)local_868._8_8_ != local_850) {
    operator_delete((void *)local_868._8_8_);
  }
  return;
}

Assistant:

TEST_F( utMetadata, get_set_string_Test ) {
    m_data = aiMetadata::Alloc( 1 );

    unsigned int index( 0 );
    bool success( false );
    const std::string key = "test";
    success = m_data->Set( index, key, aiString( std::string( "test" ) ) );
    EXPECT_TRUE( success );

    success = m_data->Set( index+10, key, aiString( std::string( "test" ) ) );
    EXPECT_FALSE( success );

    aiString result;
    success = m_data->Get( key, result );
    EXPECT_EQ( aiString( std::string( "test" ) ), result );
    EXPECT_TRUE( success );

    success = m_data->Get( "bla", result );
    EXPECT_FALSE( success );
}